

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_compression.cpp
# Opt level: O2

unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true> __thiscall
duckdb::DictionaryCompressionStorage::StringInitScan
          (DictionaryCompressionStorage *this,ColumnSegment *segment)

{
  BufferManager *pBVar1;
  pointer this_00;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::CompressedStringScanState_*,_false> local_38;
  BufferHandle local_30;
  
  pBVar1 = BufferManager::GetBufferManager(segment->db);
  (*pBVar1->_vptr_BufferManager[7])(&local_30,pBVar1,&segment->block);
  make_uniq<duckdb::CompressedStringScanState,duckdb::BufferHandle>((duckdb *)&local_38,&local_30);
  BufferHandle::~BufferHandle(&local_30);
  this_00 = unique_ptr<duckdb::CompressedStringScanState,_std::default_delete<duckdb::CompressedStringScanState>,_true>
            ::operator->((unique_ptr<duckdb::CompressedStringScanState,_std::default_delete<duckdb::CompressedStringScanState>,_true>
                          *)&local_38);
  CompressedStringScanState::Initialize(this_00,segment,true);
  *(CompressedStringScanState **)this = local_38._M_head_impl;
  return (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)
         (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)this;
}

Assistant:

unique_ptr<SegmentScanState> DictionaryCompressionStorage::StringInitScan(ColumnSegment &segment) {
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto state = make_uniq<CompressedStringScanState>(buffer_manager.Pin(segment.block));
	state->Initialize(segment, true);
	return std::move(state);
}